

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
memory::
Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
::
Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>>>&,void>
          (Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
           *this,Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
                 *other)

{
  size_type sVar1;
  int iVar2;
  void *ptr;
  void *local_20;
  
  sVar1 = (other->
          super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
          ).size_;
  if ((sVar1 == 0) || (iVar2 = posix_memalign(&local_20,0x20,sVar1 * 4), iVar2 != 0)) {
    local_20 = (void *)0x0;
  }
  *(void **)(this + 8) = local_20;
  *(size_type *)(this + 0x10) = sVar1;
  HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>::
  copy<memory::Allocator<float,memory::impl::AlignedPolicy<16ul>>,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>
            ((HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>> *)
             (this + 0x18),
             &other->
              super_ArrayView<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
             ,(ArrayView<value_type,_HostCoordinator<value_type,_Allocator<float,_AlignedPolicy<32UL>_>_>_>
               *)this);
  return;
}

Assistant:

Array(Other&& other)
        : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(other, *this);
    }